

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O2

Gia_Man_t * Gia_ManUnrollDup(Gia_Man_t *p,Vec_Int_t *vLimit)

{
  int iVar1;
  Gia_Man_t *p_00;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  
  if (vLimit->nSize != 0) {
    __assert_fail("Vec_IntSize(vLimit) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFrames.c"
                  ,0x70,"Gia_Man_t *Gia_ManUnrollDup(Gia_Man_t *, Vec_Int_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  Vec_IntPush(vLimit,p_00->nObjs);
  for (iVar4 = 0; iVar4 < p->vCos->nSize - p->nRegs; iVar4 = iVar4 + 1) {
    pGVar3 = Gia_ManCo(p,iVar4);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjId(p,pGVar3);
    Gia_ManUnrollDup_rec(p_00,pGVar3,iVar1);
  }
  Vec_IntPush(vLimit,p_00->nObjs);
  iVar4 = 1;
  while( true ) {
    if (p_00->nObjs <= iVar4) {
      Gia_ManSetRegNum(p_00,0);
      return p_00;
    }
    if ((long)vLimit->nSize < 1) break;
    if (iVar4 == vLimit->pArray[(long)vLimit->nSize + -1]) {
      Vec_IntPush(vLimit,p_00->nObjs);
    }
    pGVar3 = Gia_ManObj(p_00,iVar4);
    pGVar3 = Gia_ManObj(p,pGVar3->Value);
    iVar1 = Gia_ObjIsRo(p,pGVar3);
    if (iVar1 != 0) {
      pGVar3 = Gia_ObjRoToRi(p,pGVar3);
      if (pGVar3->Value != 0xffffffff) {
        __assert_fail("!~pObj->Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFrames.c"
                      ,0x88,"Gia_Man_t *Gia_ManUnrollDup(Gia_Man_t *, Vec_Int_t *)");
      }
      iVar1 = Gia_ObjId(p,pGVar3);
      Gia_ManUnrollDup_rec(p_00,pGVar3,iVar1);
    }
    iVar4 = iVar4 + 1;
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManUnrollDup( Gia_Man_t * p, Vec_Int_t * vLimit )  
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Vec_IntSize(vLimit) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );

    // save constant class
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Vec_IntPush( vLimit, Gia_ManObjNum(pNew) );
 
    // create first class
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManUnrollDup_rec( pNew, pObj, Gia_ObjId(p, pObj) );
    Vec_IntPush( vLimit, Gia_ManObjNum(pNew) );

    // create next classes
    for ( i = 1; i < Gia_ManObjNum(pNew); i++ )
    {
        if ( i == Vec_IntEntryLast(vLimit) )
            Vec_IntPush( vLimit, Gia_ManObjNum(pNew) );
        pObj = Gia_ManObj( p, Gia_ManObj(pNew, i)->Value );
        if ( Gia_ObjIsRo(p, pObj) )
        {
            pObj = Gia_ObjRoToRi(p, pObj);
            assert( !~pObj->Value );
            Gia_ManUnrollDup_rec( pNew, pObj, Gia_ObjId(p, pObj) );
        }
    }
    Gia_ManSetRegNum( pNew, 0 );
    return pNew;
}